

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool __thiscall testing::TestResult::Failed(TestResult *this)

{
  bool bVar1;
  int iVar2;
  TestPartResult *this_00;
  int local_1c;
  int i;
  TestResult *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = total_part_count(this);
    if (iVar2 <= local_1c) {
      return false;
    }
    this_00 = GetTestPartResult(this,local_1c);
    bVar1 = TestPartResult::failed(this_00);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool TestResult::Failed() const {
  for (int i = 0; i < total_part_count(); ++i) {
    if (GetTestPartResult(i).failed())
      return true;
  }
  return false;
}